

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommytrie.c
# Opt level: O0

void * tommy_trie_remove_existing(tommy_trie *trie,tommy_trie_node *node)

{
  long lVar1;
  tommy_trie_node *ptVar2;
  long in_FS_OFFSET;
  tommy_trie_node **let_ptr;
  tommy_key_t key;
  tommy_trie_node *ret;
  tommy_trie_node *node_local;
  tommy_trie *trie_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ptVar2 = trie_bucket_remove_existing(trie,0x1b,trie->bucket + (node->key >> 0x1b),node,node->key);
  if (ptVar2 != node) {
    __assert_fail("ret == node",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/third-party/tommyds/tommytrie.c"
                  ,0x118,"void *tommy_trie_remove_existing(tommy_trie *, tommy_trie_node *)");
  }
  trie->count = trie->count - 1;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return ptVar2->data;
  }
  __stack_chk_fail();
}

Assistant:

void* tommy_trie_remove_existing(tommy_trie* trie, tommy_trie_node* node)
{
	tommy_trie_node* ret;
	tommy_key_t key = node->key;
	tommy_trie_node** let_ptr;

	let_ptr = &trie->bucket[key >> TOMMY_TRIE_BUCKET_SHIFT];

	ret = trie_bucket_remove_existing(trie, TOMMY_TRIE_BUCKET_SHIFT, let_ptr, node, key);

	/* the element removed must match the one passed */
	assert(ret == node);

	--trie->count;

	return ret->data;
}